

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  size_t local_40;
  size_t n;
  size_t j;
  size_t i;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  local_40 = mbedtls_mpi_size(X);
  if (buflen < local_40) {
    X_local._4_4_ = -8;
  }
  else {
    memset(buf,0,buflen);
    j = buflen - 1;
    n = 0;
    for (; local_40 != 0; local_40 = local_40 - 1) {
      buf[j] = (uchar)(*(ulong *)((long)X->p + (n & 0xfffffffffffffff8)) >> (sbyte)((n & 7) << 3));
      j = j - 1;
      n = n + 1;
    }
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X, unsigned char *buf, size_t buflen )
{
    size_t i, j, n;

    n = mbedtls_mpi_size( X );

    if( buflen < n )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    memset( buf, 0, buflen );

    for( i = buflen - 1, j = 0; n > 0; i--, j++, n-- )
        buf[i] = (unsigned char)( X->p[j / ciL] >> ((j % ciL) << 3) );

    return( 0 );
}